

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

ps_search_t * state_align_search_init(char *name,cmd_ln_t *config,acmod_t *acmod,ps_alignment_t *al)

{
  uint uVar1;
  ps_searchfuncs_t *ppVar2;
  ps_alignment_t *ppVar3;
  char *pcVar4;
  ps_search_t *ppVar5;
  cmd_ln_t *pcVar6;
  ps_alignment_entry_t *ppVar7;
  int min_nframes;
  ps_alignment_entry_t *ent;
  ps_alignment_iter_t *ppStack_40;
  int i;
  ps_alignment_iter_t *itor;
  state_align_search_t *sas;
  ps_alignment_t *al_local;
  acmod_t *acmod_local;
  cmd_ln_t *config_local;
  char *name_local;
  
  name_local = (char *)__ckd_calloc__(1,0xb8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                      ,0x1b6);
  ps_search_init((ps_search_t *)name_local,&state_align_search_funcs,"state_align",name,config,acmod
                 ,al->d2p->dict,al->d2p);
  ppVar2 = (ps_searchfuncs_t *)
           hmm_context_init(acmod->mdef->n_emit_state,acmod->tmat->tp,(int16 *)0x0,acmod->mdef->sseq
                           );
  ((ps_search_t *)((long)name_local + 0x70))->vt = ppVar2;
  if (((ps_search_t *)((long)name_local + 0x70))->vt == (ps_searchfuncs_t *)0x0) {
    ckd_free(name_local);
    name_local = (char *)0x0;
  }
  else {
    ppVar3 = ps_alignment_retain(al);
    ((ps_search_t *)((long)name_local + 0x70))->type = (char *)ppVar3;
    *(uint *)&((ps_search_t *)((long)name_local + 0x70))->acmod = (uint)(al->sseq).n_ent;
    *(uint *)((long)&((ps_search_t *)((long)name_local + 0x70))->dict + 4) = (uint)(al->state).n_ent
    ;
    pcVar4 = (char *)__ckd_calloc__((long)*(int *)&((ps_search_t *)((long)name_local + 0x70))->acmod
                                    ,0x58,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                    ,0x1c5);
    ((ps_search_t *)((long)name_local + 0x70))->name = pcVar4;
    ppVar5 = (ps_search_t *)
             __ckd_calloc__((long)*(int *)&((ps_search_t *)((long)name_local + 0x70))->acmod,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                            ,0x1c6);
    ((ps_search_t *)((long)name_local + 0x70))->pls = ppVar5;
    pcVar6 = (cmd_ln_t *)
             __ckd_calloc__((long)*(int *)&((ps_search_t *)((long)name_local + 0x70))->acmod,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                            ,0x1c7);
    ((ps_search_t *)((long)name_local + 0x70))->config = pcVar6;
    ent._4_4_ = 0;
    for (ppStack_40 = ps_alignment_phones(al);
        (int)ent._4_4_ < *(int *)&((ps_search_t *)((long)name_local + 0x70))->acmod &&
        ppStack_40 != (ps_alignment_iter_t *)0x0; ppStack_40 = ps_alignment_iter_next(ppStack_40)) {
      ppVar7 = ps_alignment_iter_get(ppStack_40);
      hmm_init((hmm_context_t *)((ps_search_t *)((long)name_local + 0x70))->vt,
               (hmm_t *)(((ps_search_t *)((long)name_local + 0x70))->name +
                        (long)(int)ent._4_4_ * 0x58),0,(uint)(ppVar7->id).pid.ssid,
               (ppVar7->id).pid.tmatid);
      uVar1 = (uint)(byte)((ps_search_t *)((long)name_local + 0x70))->name
                          [(long)(int)ent._4_4_ * 0x58 + 0x51];
      if (ppVar7->duration < (int)uVar1) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                ,0x1d5,"phone %d has impossible duration %d (consider disabling bestpath search)\n",
                (ulong)ent._4_4_,(ulong)(uint)ppVar7->duration);
      }
      if ((ppVar7->start < 1) || (ppVar7->duration < (int)uVar1)) {
        *(undefined4 *)
         ((long)&((ps_search_t *)((long)name_local + 0x70))->pls->vt + (long)(int)ent._4_4_ * 4) = 0
        ;
      }
      else {
        *(int32 *)((long)&((ps_search_t *)((long)name_local + 0x70))->pls->vt +
                  (long)(int)ent._4_4_ * 4) = ppVar7->start;
      }
      if (ppVar7->duration < (int)uVar1) {
        (&((ps_search_t *)((long)name_local + 0x70))->config->refcount)[(int)ent._4_4_] = 0x7fffffff
        ;
      }
      else {
        (&((ps_search_t *)((long)name_local + 0x70))->config->refcount)[(int)ent._4_4_] =
             ppVar7->start + ppVar7->duration;
      }
      ent._4_4_ = ent._4_4_ + 1;
    }
  }
  return (ps_search_t *)name_local;
}

Assistant:

ps_search_t *
state_align_search_init(const char *name,
                        cmd_ln_t *config,
                        acmod_t *acmod,
                        ps_alignment_t *al)
{
    state_align_search_t *sas;
    ps_alignment_iter_t *itor;
    int i;

    sas = ckd_calloc(1, sizeof(*sas));
    ps_search_init(ps_search_base(sas), &state_align_search_funcs,
		   PS_SEARCH_TYPE_STATE_ALIGN, name,
                   config, acmod, al->d2p->dict, al->d2p);
    sas->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (sas->hmmctx == NULL) {
        ckd_free(sas);
        return NULL;
    }
    sas->al = ps_alignment_retain(al);

    /* Generate HMM vector from phone level of alignment. */
    sas->n_phones = ps_alignment_n_phones(al);
    sas->n_emit_state = ps_alignment_n_states(al);
    sas->hmms = ckd_calloc(sas->n_phones, sizeof(*sas->hmms));
    sas->sf = ckd_calloc(sas->n_phones, sizeof(*sas->sf));
    sas->ef = ckd_calloc(sas->n_phones, sizeof(*sas->ef));
    for (i = 0, itor = ps_alignment_phones(al);
         i < sas->n_phones && itor;
         ++i, itor = ps_alignment_iter_next(itor)) {
        ps_alignment_entry_t *ent = ps_alignment_iter_get(itor);
        int min_nframes;
        
        hmm_init(sas->hmmctx, &sas->hmms[i], FALSE,
                 ent->id.pid.ssid, ent->id.pid.tmatid);
        /* Can't align less than the number of frames in an HMM! */
        min_nframes = hmm_n_emit_state(&sas->hmms[i]);
        if (ent->duration < min_nframes)
            E_WARN("phone %d has impossible duration %d "
                   "(consider disabling bestpath search)\n",
                   i, ent->duration);
        if (ent->start > 0 && ent->duration >= min_nframes)
            sas->sf[i] = ent->start;
        else
            sas->sf[i] = 0; /* Always active */
        if (ent->duration >= min_nframes)
            sas->ef[i] = ent->start + ent->duration;
        else
            sas->ef[i] = INT_MAX; /* Always active */
    }
    return ps_search_base(sas);
}